

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O1

string * bssl::anon_unknown_12::BuildAttrName(string *__return_storage_ptr__,string *name,int iter)

{
  pointer pcVar1;
  long lVar2;
  uint uVar3;
  long *plVar4;
  uint uVar5;
  size_type *psVar6;
  ulong uVar7;
  uint __val;
  uint __len;
  string __str;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  if (iter == 1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + name->_M_string_length);
    goto LAB_00319be3;
  }
  local_70 = local_60;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  __val = -iter;
  if (0 < iter) {
    __val = iter;
  }
  __len = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar5 = (uint)uVar7;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_00319b0d;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_00319b0d;
      }
      if (uVar5 < 10000) goto LAB_00319b0d;
      uVar7 = uVar7 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_00319b0d:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)(iter >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)iter >> 0x1f) + (long)local_50),__len,__val);
  uVar7 = 0xf;
  if (local_70 != local_60) {
    uVar7 = local_60[0];
  }
  if (uVar7 < (ulong)(local_48 + local_68)) {
    uVar7 = 0xf;
    if (local_50 != local_40) {
      uVar7 = local_40[0];
    }
    if (uVar7 < (ulong)(local_48 + local_68)) goto LAB_00319b85;
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_00319b85:
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
LAB_00319be3:
  if (iter != 1) {
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BuildAttrName(const std::string &name, int iter) {
  return iter == 1 ? name : name + "/" + std::to_string(iter);
}